

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::GeneratorResponseContext::GeneratorResponseContext
          (GeneratorResponseContext *this,Version *compiler_version,CodeGeneratorResponse *response,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *parsed_files_local;
  CodeGeneratorResponse *response_local;
  Version *compiler_version_local;
  GeneratorResponseContext *this_local;
  
  GeneratorContext::GeneratorContext(&this->super_GeneratorContext);
  (this->super_GeneratorContext)._vptr_GeneratorContext =
       (_func_int **)&PTR__GeneratorResponseContext_0084e3b0;
  Version::Version(&this->compiler_version_,compiler_version);
  this->response_ = response;
  this->parsed_files_ = parsed_files;
  return;
}

Assistant:

GeneratorResponseContext(
      const Version& compiler_version, CodeGeneratorResponse* response,
      const std::vector<const FileDescriptor*>& parsed_files)
      : compiler_version_(compiler_version),
        response_(response),
        parsed_files_(parsed_files) {}